

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EmissionSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EmissionSystem *this)

{
  pointer pEVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  pointer pEVar3;
  KStringStream ss;
  KString KStack_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"Emission System:\n\t");
  poVar2 = std::operator<<(poVar2,"System Data Length (32 bits):    ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8SystemDataLength);
  poVar2 = std::operator<<(poVar2,"\n\t");
  poVar2 = std::operator<<(poVar2,"Number Of Emitter Beams:         ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumberOfBeams);
  poVar2 = std::operator<<(poVar2,"\n");
  EmitterSystem::GetAsString_abi_cxx11_(&KStack_218,&this->m_EmitterSystemRecord);
  UTILS::IndentString(&local_1f8,&KStack_218,Tabs,in_CL);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Location:   ");
  Vector::GetAsString_abi_cxx11_(&local_1d8,&this->m_Location);
  std::operator<<(poVar2,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&KStack_218);
  pEVar1 = (this->m_vEmitterBeams).
           super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar3 = (this->m_vEmitterBeams).
                super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&KStack_218,pEVar3);
    UTILS::IndentString(&local_1f8,&KStack_218,Tabs_00,in_CL);
    std::operator<<(local_1a8,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&KStack_218);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString EmissionSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Emission System:\n\t"
       << "System Data Length (32 bits):    " << ( KUINT16 )m_ui8SystemDataLength            << "\n\t"
       << "Number Of Emitter Beams:         " << ( KUINT16 )m_ui8NumberOfBeams               << "\n"
       << IndentString( m_EmitterSystemRecord.GetAsString(), 1 )                             << "\t"
       << "Location:   " << m_Location.GetAsString();

    vector<EmitterBeam>::const_iterator citr = m_vEmitterBeams.begin();
    vector<EmitterBeam>::const_iterator citrEnd = m_vEmitterBeams.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}